

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O1

basic_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>,_header_type,_unodb::db>
unodb::detail::
make_db_leaf_ptr<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db>
          (art_key_type k,value_view v,
          db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db)

{
  length_error *this;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *extraout_RDX;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *extraout_RDX_00;
  _Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
  _Var1;
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *in_R8;
  undefined1 *unaff_R12;
  int unaff_R13D;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 unaff_R14;
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *unaff_R15;
  basic_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>,_header_type,_unodb::db> bVar2;
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *local_50;
  pointer local_48;
  void *local_40;
  undefined4 *local_38;
  
  if ((ulong)db >> 0x20 == 0) {
    unaff_R12 = (undefined1 *)((long)(db->node_counts)._M_elems + 3);
    test::allocation_failure_injector::maybe_fail();
    unaff_R13D = posix_memalign(&local_38,0x10,(size_t)unaff_R12);
    unaff_R14 = k.field_0;
    unaff_R15 = db;
    local_50 = in_R8;
    local_48 = v._M_ptr;
    local_40 = (void *)v._M_extent._M_extent_value._M_extent_value;
    if (unaff_R13D == 0) goto LAB_00159005;
  }
  else {
    this = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error(this,"Value length must fit in std::uint32_t");
    make_db_leaf_ptr<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db>
              ((detail *)this);
  }
  make_db_leaf_ptr<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db>();
LAB_00159005:
  if (unaff_R13D == 0xc || local_38 != (undefined4 *)0x0) {
    if (local_38 != (undefined4 *)0x0) {
      db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::increase_memory_use
                (local_50,(size_t)unaff_R12);
      (local_50->node_counts)._M_elems[0] = (local_50->node_counts)._M_elems[0] + 1;
      *local_38 = 8;
      local_38[1] = (int)unaff_R15;
      *(pointer *)(local_38 + 2) = local_48;
      _Var1._M_head_impl = extraout_RDX;
      if (unaff_R15 != (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)0x0
         ) {
        memcpy(local_38 + 4,local_40,(size_t)unaff_R15);
        _Var1._M_head_impl = extraout_RDX_00;
      }
      *(db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> **)unaff_R14 =
           local_50;
      *(undefined4 **)(unaff_R14.key + 8) = local_38;
      bVar2._M_t.
      super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      .
      super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
      ._M_head_impl = _Var1._M_head_impl;
      bVar2._M_t.
      super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      .
      super__Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      .
      super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
      ._M_head_impl.db =
           (_Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
            )(_Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
              )unaff_R14.key;
      return (basic_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>,_header_type,_unodb::db>
              )bVar2._M_t.
               super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ;
    }
    make_db_leaf_ptr<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db>();
  }
  __assert_fail("result != nullptr || err == 12",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./heap.hpp"
                ,0x40,"void *unodb::detail::allocate_aligned(std::size_t, std::size_t)");
}

Assistant:

[[nodiscard]] auto make_db_leaf_ptr(
    basic_art_key<Key> k, value_view v,
    Db<Key, Value> &db UNODB_DETAIL_LIFETIMEBOUND) {
  using db_type = Db<Key, Value>;
  using header_type = typename db_type::header_type;
  using leaf_type = basic_leaf<Key, header_type>;

  // TODO(thompsonbry) We should have a discussion about limits.  To
  // my mind, limits should be explicit configuration values, not
  // uint32_t.
  if constexpr (std::is_same_v<Key, key_view>) {
    if (UNODB_DETAIL_UNLIKELY(k.size() > leaf_type::max_key_size)) {
      throw std::length_error("Key length must fit in std::uint32_t");
    }
  }

  if (UNODB_DETAIL_UNLIKELY(v.size_bytes() > leaf_type::max_value_size)) {
    throw std::length_error("Value length must fit in std::uint32_t");
  }

  const auto size = leaf_type::compute_size(
      static_cast<typename leaf_type::key_size_type>(k.size()),
      static_cast<typename leaf_type::value_size_type>(v.size_bytes()));

  auto *const leaf_mem = static_cast<std::byte *>(
      allocate_aligned(size, alignment_for_new<leaf_type>()));

#ifdef UNODB_DETAIL_WITH_STATS
  db.increment_leaf_count(size);
#endif  // UNODB_DETAIL_WITH_STATS

  return basic_db_leaf_unique_ptr<Key, Value, header_type, Db>{
      new (leaf_mem) leaf_type{k, v}, basic_db_leaf_deleter<db_type>{db}};
}